

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_common.hpp
# Opt level: O1

void __thiscall
spirv_cross::SPIRAccessChain::SPIRAccessChain
          (SPIRAccessChain *this,TypeID basetype_,StorageClass storage_,string *base_,
          string *dynamic_index_,int32_t static_index_)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  pointer pcVar3;
  undefined8 uVar4;
  
  (this->super_IVariant).self.id = 0;
  (this->super_IVariant)._vptr_IVariant = (_func_int **)&PTR__SPIRAccessChain_003a8fd0;
  *(uint32_t *)&(this->super_IVariant).field_0xc = basetype_.id;
  this->storage = storage_;
  paVar1 = &(this->base).field_2;
  (this->base)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (base_->_M_dataplus)._M_p;
  paVar2 = &base_->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&base_->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->base).field_2 + 8) = uVar4;
  }
  else {
    (this->base)._M_dataplus._M_p = pcVar3;
    (this->base).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->base)._M_string_length = base_->_M_string_length;
  (base_->_M_dataplus)._M_p = (pointer)paVar2;
  base_->_M_string_length = 0;
  (base_->field_2)._M_local_buf[0] = '\0';
  paVar1 = &(this->dynamic_index).field_2;
  (this->dynamic_index)._M_dataplus._M_p = (pointer)paVar1;
  pcVar3 = (dynamic_index_->_M_dataplus)._M_p;
  paVar2 = &dynamic_index_->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 == paVar2) {
    uVar4 = *(undefined8 *)((long)&dynamic_index_->field_2 + 8);
    paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
    *(undefined8 *)((long)&(this->dynamic_index).field_2 + 8) = uVar4;
  }
  else {
    (this->dynamic_index)._M_dataplus._M_p = pcVar3;
    (this->dynamic_index).field_2._M_allocated_capacity = paVar2->_M_allocated_capacity;
  }
  (this->dynamic_index)._M_string_length = dynamic_index_->_M_string_length;
  (dynamic_index_->_M_dataplus)._M_p = (pointer)paVar2;
  dynamic_index_->_M_string_length = 0;
  (dynamic_index_->field_2)._M_local_buf[0] = '\0';
  this->static_index = static_index_;
  (this->implied_read_expressions).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
  ptr = (TypedID<(spirv_cross::Types)0> *)0x0;
  (this->implied_read_expressions).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
  buffer_size = 0;
  this->loaded_from = 0;
  this->matrix_stride = 0;
  *(undefined8 *)((long)&this->matrix_stride + 2) = 0;
  (this->implied_read_expressions).super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)0>_>.
  ptr = (TypedID<(spirv_cross::Types)0> *)&(this->implied_read_expressions).stack_storage;
  (this->implied_read_expressions).buffer_capacity = 8;
  return;
}

Assistant:

TypedID(uint32_t id_)
	    : id(id_)
	{
	}